

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O1

int tnt_reply0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  size_t local_50;
  size_t hdr_length;
  size_t local_40;
  size_t local_38;
  size_t length;
  
  iVar1 = tnt_reply_len(buf,size,&local_38);
  local_40 = local_38;
  if (iVar1 == 0) {
    if (r == (tnt_reply *)0x0) {
      iVar1 = 0;
    }
    else {
      hdr_length = local_38 - 5;
      iVar1 = tnt_reply_hdr0(r,buf + 5,hdr_length,&local_50);
      if (iVar1 != 0) {
        return -1;
      }
      if ((hdr_length - local_50 != 0) &&
         (iVar1 = tnt_reply_body0(r,buf + 5 + local_50,hdr_length - local_50,(size_t *)0x0),
         iVar1 != 0)) {
        return -1;
      }
      iVar1 = 0;
    }
  }
  else {
    if (iVar1 != 1) {
      return -1;
    }
    iVar1 = 1;
  }
  if (off != (size_t *)0x0) {
    *off = local_40;
  }
  return iVar1;
}

Assistant:

int
tnt_reply0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	/* supplied buffer must contain full reply,
	 * if it doesn't then returning count of bytes
	 * needed to process */
	size_t length;
	switch (tnt_reply_len(buf, size, &length)) {
	case 0:
		break;
	case 1:
		if (off)
			*off = length;
		return 1;
	default:
		return -1;
	}
	if (r == NULL) {
		if (off)
			*off = length;
		return 0;
	}
	const char *data = buf + TNT_REPLY_IPROTO_HDR_SIZE;
	size_t data_length = length - TNT_REPLY_IPROTO_HDR_SIZE;
	size_t hdr_length;
	if (tnt_reply_hdr0(r, data, data_length, &hdr_length) != 0)
		return -1;
	if (data_length != hdr_length) {
		if (tnt_reply_body0(r, data + hdr_length, data_length - hdr_length, NULL) != 0)
			return -1;
	}
	if (off)
		*off = length;
	return 0;
}